

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

int Tas_ManPropagate(Tas_Man_t *p,int Level)

{
  Tas_Cls_t *pClause;
  Gia_Obj_t *pGVar1;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  Gia_Obj_t **ppGVar8;
  ulong uVar9;
  uint uVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  Gia_Obj_t *pGVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  int *piVar23;
  long lVar24;
  ulong uVar25;
  
  do {
    iVar21 = (p->pProp).iHead;
    lVar17 = (long)iVar21;
    uVar14 = (p->pProp).iTail;
    uVar9 = (ulong)uVar14;
    if (iVar21 < (int)uVar14) {
      do {
        uVar14 = (uint)uVar9;
        pGVar1 = (p->pProp).pData[lVar17];
        if (pGVar1 == (Gia_Obj_t *)0x0) break;
        if (((ulong)pGVar1 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x479,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        if (((uint)*(undefined8 *)pGVar1 >> 0x1e & 1) == 0) {
          __assert_fail("Tas_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x47a,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        s_Counter3 = s_Counter3 + 1;
        pGVar12 = p->pAig->pObjs;
        if ((pGVar1 < pGVar12) || (pGVar12 + p->pAig->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar21 = (int)((ulong)((long)pGVar1 - (long)pGVar12) >> 2);
        if (iVar21 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar14 = ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x3e) & 1) + iVar21 * 0x55555556;
        iVar21 = p->pWatches[uVar14 ^ 1];
        if (iVar21 == 0) {
LAB_00723745:
          uVar9 = *(ulong *)pGVar1;
          uVar14 = (uint)uVar9;
          if ((~uVar14 & 0x9fffffff) != 0) {
            if (((int)uVar14 < 0) || (uVar10 = uVar14 & 0x1fffffff, uVar10 == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pVar)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                            ,0x488,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
            }
            uVar13 = ((uint)(uVar9 >> 0x1d) & 7 ^
                     (uint)((ulong)*(undefined8 *)(pGVar1 + -(ulong)uVar10) >> 0x3e)) & 1;
            uVar5 = (uint)*(undefined8 *)(pGVar1 + -(ulong)uVar10);
            if ((uVar5 >> 0x1e & 1) == 0) {
              uVar13 = 2;
            }
            uVar20 = (uint)(uVar9 >> 0x20);
            uVar25 = (ulong)(uVar20 & 0x1fffffff);
            uVar16 = (uint)*(undefined8 *)(pGVar1 + -uVar25);
            uVar20 = (uVar20 >> 0x1d ^ (uint)((ulong)*(undefined8 *)(pGVar1 + -uVar25) >> 0x3e)) & 1
            ;
            if ((uVar16 >> 0x1e & 1) == 0) {
              uVar20 = 2;
            }
            if ((uVar14 >> 0x1e & 1) == 0) goto LAB_00723f02;
            pGVar12 = pGVar1 + -(ulong)uVar10;
            pGVar19 = pGVar1 + -uVar25;
            if ((uVar9 & 0x4000000000000000) == 0) {
              if (uVar20 != 0 && uVar13 != 0) {
                if ((uVar13 == 1) && (uVar20 == 1)) goto LAB_00723bd7;
                if ((uVar13 == 1) || (uVar20 == 1)) {
                  if ((uVar5 >> 0x1e & 1) == 0) {
                    Tas_ManAssign(p,(Gia_Obj_t *)
                                    (((ulong)(uVar14 >> 0x1d & 1) | (ulong)pGVar12) ^ 1),Level,
                                  pGVar1,pGVar19);
                  }
                  if ((uVar16 >> 0x1e & 1) == 0) {
                    uVar9 = *(ulong *)pGVar1;
                    pGVar19 = (Gia_Obj_t *)
                              (((ulong)((uint)(uVar9 >> 0x3d) & 1) |
                               (ulong)(pGVar1 + -(uVar9 >> 0x20 & 0x1fffffff))) ^ 1);
                    pGVar12 = pGVar1 + -(uVar9 & 0x1fffffff);
                    goto LAB_0072397f;
                  }
                }
                else {
                  if (((uVar5 | uVar16) >> 0x1e & 1) != 0) {
                    __assert_fail("Tas_VarIsJust(pVar)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                                  ,0x4a9,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
                  }
                  iVar21 = (p->pJust).iHead;
                  lVar22 = (long)iVar21;
                  iVar6 = (p->pJust).iTail;
                  if (iVar21 < iVar6) {
                    do {
                      pGVar12 = (p->pJust).pData[lVar22];
                      if (pGVar12 == (Gia_Obj_t *)0x0) break;
                      if (pGVar12 == pGVar1) {
                        __assert_fail("!Tas_QueHasNode( &p->pJust, pVar )",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                                      ,0x4aa,
                                      "int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
                      }
                      lVar22 = lVar22 + 1;
                    } while (iVar6 != lVar22);
                  }
                  if (iVar6 == (p->pJust).nSize) {
                    (p->pJust).nSize = iVar6 * 2;
                    ppGVar8 = (p->pJust).pData;
                    sVar18 = (long)iVar6 << 4;
                    if (ppGVar8 == (Gia_Obj_t **)0x0) {
                      ppGVar8 = (Gia_Obj_t **)malloc(sVar18);
                    }
                    else {
                      ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,sVar18);
                      iVar6 = (p->pJust).iTail;
                    }
                    (p->pJust).pData = ppGVar8;
                  }
                  else {
                    ppGVar8 = (p->pJust).pData;
                  }
                  (p->pJust).iTail = iVar6 + 1;
                  ppGVar8[iVar6] = pGVar1;
                }
              }
            }
            else {
              if (uVar20 == 0 || uVar13 == 0) {
                if (((uVar13 == 0) && (pGVar11 = pGVar12, uVar20 != 0)) ||
                   ((uVar13 != 0 && (pGVar11 = pGVar19, uVar20 == 0)))) {
                  pGVar19 = (Gia_Obj_t *)0x0;
                  pGVar12 = pGVar11;
                }
                else if (uVar13 != 0 || uVar20 != 0) {
                  __assert_fail("Value0 == 0 && Value1 == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                                ,0x493,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
                }
LAB_00723bd7:
                iVar21 = Tas_ManAnalyze(p,Level,pGVar1,pGVar12,pGVar19);
                goto LAB_00723be3;
              }
              if ((uVar5 >> 0x1e & 1) == 0) {
                Tas_ManAssign(p,(Gia_Obj_t *)((ulong)(uVar14 >> 0x1d & 1) | (ulong)pGVar12),Level,
                              pGVar1,(Gia_Obj_t *)0x0);
              }
              if ((uVar16 >> 0x1e & 1) == 0) {
                uVar14 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
                pGVar19 = (Gia_Obj_t *)
                          ((ulong)(uVar14 >> 0x1d & 1) |
                          (ulong)(pGVar1 + -(ulong)(uVar14 & 0x1fffffff)));
                pGVar12 = (Gia_Obj_t *)0x0;
LAB_0072397f:
                Tas_ManAssign(p,pGVar19,Level,pGVar1,pGVar12);
              }
            }
          }
        }
        else {
          piVar23 = p->pWatches + (uVar14 ^ 1);
LAB_007235b9:
          piVar2 = (p->pStore).pData;
          lVar22 = (long)iVar21;
          pClause = (Tas_Cls_t *)(piVar2 + lVar22);
          uVar5 = pClause[1].iNext[0];
          uVar10 = pClause[1].iNext[1];
          if (uVar5 == uVar14) {
            pClause[1].iNext[0] = uVar10;
            pClause[1].iNext[1] = uVar14;
            *(ulong *)pClause->iNext =
                 CONCAT44((int)*(undefined8 *)pClause->iNext,
                          (int)((ulong)*(undefined8 *)pClause->iNext >> 0x20));
            uVar5 = uVar10;
          }
          else if (uVar10 != uVar14) {
            __assert_fail("pCur->pLits[1] == LitF",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x42e,"int Tas_ManPropagateWatch(Tas_Man_t *, int, int)");
          }
          if ((int)uVar5 < 0) goto LAB_00723e67;
          pGVar7 = p->pAig;
          if (pGVar7->nObjs <= (int)(uVar5 >> 1)) goto LAB_00723e48;
          uVar3 = *(undefined8 *)(pGVar7->pObjs + (uVar5 >> 1));
          if ((((uint)uVar3 >> 0x1e & 1) != 0) &&
             ((((uint)((ulong)uVar3 >> 0x3e) ^ uVar5) & 1) != 0)) {
LAB_00723733:
            piVar23 = pClause->iNext + 1;
LAB_0072373a:
            iVar21 = *piVar23;
            if (iVar21 == 0) goto LAB_00723745;
            goto LAB_007235b9;
          }
          uVar9 = (ulong)(uint)pClause->nLits;
          uVar25 = 2;
          if (pClause->nLits < 3) {
LAB_007236d3:
            if ((int)uVar9 <= (int)uVar25) {
              pGVar7 = p->pAig;
              uVar5 = pClause[1].iNext[0];
              goto LAB_007236e1;
            }
            goto LAB_0072373a;
          }
          uVar25 = 2;
          do {
            uVar10 = piVar2[lVar22 + uVar25 + 3];
            if ((int)uVar10 < 0) goto LAB_00723e67;
            if ((uint)pGVar7->nObjs <= uVar10 >> 1) goto LAB_00723e48;
            uVar3 = *(undefined8 *)(pGVar7->pObjs + (uVar10 >> 1));
            if ((((uint)uVar3 >> 0x1e & 1) == 0) ||
               ((((uint)((ulong)uVar3 >> 0x3e) ^ uVar10) & 1) != 0)) {
              piVar2[lVar22 + 4] = uVar10;
              pClause[1].iNext[uVar25] = uVar14;
              *piVar23 = piVar2[lVar22 + 1];
              Tas_ManWatchClause(p,pClause,piVar2[lVar22 + 4]);
              uVar9 = (ulong)(uint)piVar2[lVar22 + 2];
              goto LAB_007236d3;
            }
            uVar25 = uVar25 + 1;
          } while (uVar9 != uVar25);
LAB_007236e1:
          if ((int)uVar5 < 0) goto LAB_00723e67;
          uVar10 = uVar5 >> 1;
          if (pGVar7->nObjs <= (int)uVar10) goto LAB_00723e48;
          uVar3 = *(undefined8 *)(pGVar7->pObjs + uVar10);
          if (((uint)uVar3 >> 0x1e & 1) == 0) {
            Tas_ManAssign(p,(Gia_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)(pGVar7->pObjs + uVar10)),
                          Level,(Gia_Obj_t *)0x0,(Gia_Obj_t *)pClause);
            goto LAB_00723733;
          }
          if (((uVar5 ^ (uint)((ulong)uVar3 >> 0x3e)) & 1) != 0) {
            __assert_fail("!Tas_LitIsTrue( pObj, pCur->pLits[0] )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x463,"int Tas_ManPropagateWatch(Tas_Man_t *, int, int)");
          }
          iVar21 = (p->pClauses).iHead;
          if (iVar21 != (p->pClauses).iTail) {
            __assert_fail("Tas_QueIsEmpty( pQue )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x402,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
          }
          if (iVar21 == (p->pClauses).nSize) {
            (p->pClauses).nSize = iVar21 * 2;
            ppGVar8 = (p->pClauses).pData;
            if (ppGVar8 == (Gia_Obj_t **)0x0) {
              ppGVar8 = (Gia_Obj_t **)malloc((long)iVar21 << 4);
            }
            else {
              ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,(long)iVar21 << 4);
              iVar21 = (p->pClauses).iTail;
              uVar9 = (ulong)(uint)pClause->nLits;
            }
            (p->pClauses).pData = ppGVar8;
          }
          else {
            ppGVar8 = (p->pClauses).pData;
          }
          iVar6 = iVar21 + 1;
          (p->pClauses).iTail = iVar6;
          ppGVar8[iVar21] = (Gia_Obj_t *)0x0;
          if (0 < (int)uVar9) {
            lVar24 = 0;
            do {
              uVar14 = piVar2[lVar22 + lVar24 + 3];
              if ((int)uVar14 < 0) {
LAB_00723e67:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              uVar10 = uVar14 >> 1;
              if (p->pAig->nObjs <= (int)uVar10) {
LAB_00723e48:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              pGVar12 = p->pAig->pObjs;
              uVar3 = *(undefined8 *)(pGVar12 + uVar10);
              if (((uint)uVar3 >> 0x1e & 1) == 0) {
                __assert_fail("Tas_VarIsAssigned(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                              ,0x407,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
              }
              if ((((uint)((ulong)uVar3 >> 0x3e) ^ uVar14) & 1) != 0) {
                __assert_fail("!Tas_LitIsTrue( pObj, pCls->pLits[i] )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                              ,0x408,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
              }
              if (iVar6 == (p->pClauses).nSize) {
                (p->pClauses).nSize = iVar6 * 2;
                ppGVar8 = (p->pClauses).pData;
                sVar18 = (long)(iVar6 * 2) << 3;
                if (ppGVar8 == (Gia_Obj_t **)0x0) {
                  ppGVar8 = (Gia_Obj_t **)malloc(sVar18);
                }
                else {
                  ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,sVar18);
                  iVar6 = (p->pClauses).iTail;
                  uVar9 = (ulong)(uint)pClause->nLits;
                }
                (p->pClauses).pData = ppGVar8;
              }
              else {
                ppGVar8 = (p->pClauses).pData;
              }
              lVar15 = (long)iVar6;
              iVar6 = iVar6 + 1;
              (p->pClauses).iTail = iVar6;
              ppGVar8[lVar15] = pGVar12 + uVar10;
              lVar24 = lVar24 + 1;
            } while (lVar24 < (int)uVar9);
          }
          Tas_ManDeriveReason(p,Level);
          iVar21 = (p->pClauses).iHead;
          iVar6 = (p->pClauses).iTail;
          if (iVar6 <= iVar21) {
            __assert_fail("p->iHead < p->iTail",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x1a5,"int Tas_QueFinish(Tas_Que_t *)");
          }
          if (iVar6 == (p->pClauses).nSize) {
            (p->pClauses).nSize = iVar6 * 2;
            ppGVar8 = (p->pClauses).pData;
            if (ppGVar8 == (Gia_Obj_t **)0x0) {
              ppGVar8 = (Gia_Obj_t **)malloc((long)iVar6 << 4);
            }
            else {
              ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,(long)iVar6 << 4);
              iVar6 = (p->pClauses).iTail;
            }
            (p->pClauses).pData = ppGVar8;
          }
          else {
            ppGVar8 = (p->pClauses).pData;
          }
          (p->pClauses).iTail = iVar6 + 1;
          ppGVar8[iVar6] = (Gia_Obj_t *)0x0;
          (p->pClauses).iHead = iVar6 + 1;
          if (iVar21 == 0) goto LAB_00723745;
LAB_00723be3:
          if (iVar21 != 0) {
            return iVar21;
          }
        }
        lVar17 = lVar17 + 1;
        uVar14 = (p->pProp).iTail;
        uVar9 = (ulong)(int)uVar14;
      } while (lVar17 < (long)uVar9);
    }
    (p->pProp).iHead = uVar14;
    iVar21 = (p->pJust).iHead;
    iVar6 = (p->pJust).iTail;
    if (iVar21 < iVar6) {
      lVar17 = (long)iVar21;
      ppGVar8 = (p->pJust).pData;
      pGVar1 = ppGVar8[lVar17];
      iVar4 = s_Counter4;
      while (s_Counter4 = iVar4, pGVar1 != (Gia_Obj_t *)0x0) {
        lVar17 = lVar17 + 1;
        uVar9 = *(ulong *)pGVar1;
        uVar14 = (uint)uVar9;
        if (((int)uVar14 < 0) || (uVar10 = uVar14 & 0x1fffffff, uVar10 == 0x1fffffff)) {
          s_Counter4 = iVar4 + 1;
          if (((ulong)pGVar1 & 1) == 0) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4bf,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
          }
LAB_00723f4c:
          s_Counter4 = iVar4 + 1;
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x4be,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        uVar5 = (uint)*(undefined8 *)(pGVar1 + -(ulong)uVar10);
        uVar13 = (uint)(uVar9 >> 0x20);
        if (((uVar5 >> 0x1e & 1) == 0) &&
           ((pGVar1[-(ulong)(uVar13 & 0x1fffffff)].field_0x3 & 0x40) == 0)) {
          lVar22 = (long)iVar21;
          iVar21 = iVar21 + 1;
          ppGVar8[lVar22] = pGVar1;
        }
        else {
          s_Counter4 = iVar4 + 1;
          if (((ulong)pGVar1 & 1) != 0) goto LAB_00723f4c;
          if (uVar14 < 0x40000000) {
            __assert_fail("Tas_VarIsAssigned(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4c0,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
          }
          if ((uVar14 >> 0x1e & 1) == 0) {
LAB_00723f02:
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x78,"int Tas_VarValue(Gia_Obj_t *)");
          }
          if ((uVar9 & 0x4000000000000000) != 0) {
            __assert_fail("!Tas_VarValue(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4c1,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
          }
          uVar14 = ((uint)(uVar9 >> 0x1d) & 7 ^
                   (uint)((ulong)*(undefined8 *)(pGVar1 + -(ulong)uVar10) >> 0x3e)) & 1;
          if ((uVar5 >> 0x1e & 1) == 0) {
            uVar14 = 2;
          }
          uVar16 = (uint)*(undefined8 *)(pGVar1 + -(ulong)(uVar13 & 0x1fffffff));
          uVar20 = (uVar13 >> 0x1d ^
                   (uint)((ulong)*(undefined8 *)(pGVar1 + -(ulong)(uVar13 & 0x1fffffff)) >> 0x3e)) &
                   1;
          if ((uVar16 >> 0x1e & 1) == 0) {
            uVar20 = 2;
          }
          if ((uVar14 != 0) && (uVar20 != 0)) {
            if ((uVar14 == 1) && (uVar20 == 1)) {
              iVar6 = Tas_ManAnalyze(p,Level,pGVar1,pGVar1 + -(ulong)uVar10,
                                     pGVar1 + -(ulong)(uVar13 & 0x1fffffff));
              if (iVar6 != 0) {
                return iVar6;
              }
            }
            else {
              if ((uVar14 != 1) && (uVar20 != 1)) {
                __assert_fail("Value0 == 1 || Value1 == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                              ,0x4c9,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
              }
              if ((uVar5 >> 0x1e & 1) == 0) {
                Tas_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)((uint)(uVar9 >> 0x1d) & 1) |
                                 (ulong)(pGVar1 + -(ulong)uVar10)) ^ 1),Level,pGVar1,
                              pGVar1 + -(ulong)(uVar13 & 0x1fffffff));
              }
              if ((uVar16 >> 0x1e & 1) == 0) {
                uVar9 = *(ulong *)pGVar1;
                Tas_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)((uint)(uVar9 >> 0x3d) & 1) |
                                 (ulong)(pGVar1 + -(uVar9 >> 0x20 & 0x1fffffff))) ^ 1),Level,pGVar1,
                              pGVar1 + -(uVar9 & 0x1fffffff));
              }
            }
          }
        }
        iVar6 = (p->pJust).iTail;
        if (iVar6 <= lVar17) break;
        ppGVar8 = (p->pJust).pData;
        iVar4 = s_Counter4;
        pGVar1 = ppGVar8[lVar17];
      }
    }
    if (iVar21 == iVar6) {
      return 0;
    }
    (p->pJust).iTail = iVar21;
  } while( true );
}

Assistant:

int Tas_ManPropagate( Tas_Man_t * p, int Level )
{
    int hClause;
    Gia_Obj_t * pVar;
    int i, k;//, nIter = 0;
    while ( 1 )
    {
//        nIter++;
        Tas_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( (hClause = Tas_ManPropagateOne( p, pVar, Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Tas_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Tas_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( (hClause = Tas_ManPropagateTwo( p, pVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
//    printf( "%d ", nIter );
    return 0;
}